

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O0

dev_t pack_netbsd(int n,unsigned_long *numbers,char **error)

{
  ulong uVar1;
  ulong local_28;
  dev_t dev;
  char **error_local;
  unsigned_long *numbers_local;
  int n_local;
  
  local_28 = 0;
  if (n == 2) {
    uVar1 = (*numbers & 0xfff) << 8 | (numbers[1] & 0xfff00) << 0xc;
    local_28 = uVar1 | numbers[1] & 0xff;
    if ((long)(int)((uint)(uVar1 >> 8) & 0xfff) == *numbers) {
      if ((long)(int)((uint)(numbers[1] & 0xfff00) | (uint)local_28 & 0xff) != numbers[1]) {
        *error = "invalid minor number";
      }
    }
    else {
      *error = "invalid major number";
    }
  }
  else {
    *error = "too many fields for format";
  }
  return local_28;
}

Assistant:

static dev_t
pack_netbsd(int n, unsigned long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_netbsd(numbers[0], numbers[1]);
		if ((unsigned long)major_netbsd(dev) != numbers[0])
			*error = iMajorError;
		else if ((unsigned long)minor_netbsd(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}